

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

bool __thiscall CppGenerator::resortView(CppGenerator *this,size_t *inc_view_id,size_t *view_id)

{
  bool bVar1;
  element_type *this_00;
  size_t sVar2;
  long *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  size_t *var;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  size_t orderIdx;
  View *view;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff78;
  QueryCompiler *in_stack_ffffffffffffff80;
  bitset<100UL> *in_stack_ffffffffffffff88;
  reference local_60;
  reference local_50;
  unsigned_long *local_48;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_40;
  long local_38;
  long local_30;
  View *local_28;
  long *local_20;
  undefined8 *local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2e3629);
  local_28 = QueryCompiler::getView(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
  local_30 = 0;
  local_38 = *(long *)(in_RDI + 0x88) + *local_20 * 0x18;
  local_40._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_ffffffffffffff78);
  local_48 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       (in_stack_ffffffffffffff78);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) {
      return false;
    }
    local_50 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_40);
    std::bitset<100UL>::operator[](in_stack_ffffffffffffff88,(size_t)in_stack_ffffffffffffff80);
    bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_ffffffffffffff80);
    std::bitset<100UL>::reference::~reference(&local_60);
    if (bVar1) {
      in_stack_ffffffffffffff88 = *(bitset<100UL> **)(in_RDI + 0x108);
      in_stack_ffffffffffffff80 = (QueryCompiler *)*local_18;
      this_00 = std::
                __shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2e3710);
      sVar2 = TreeDecomposition::numberOfRelations(this_00);
      if (*(unsigned_long *)
           ((in_stack_ffffffffffffff88->super__Base_bitset<2UL>)._M_w
            [(long)&(in_stack_ffffffffffffff80->_td).
                    super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr + sVar2
            ] + local_30 * 8) != *local_50) {
        return true;
      }
      local_30 = local_30 + 1;
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_40);
  } while( true );
}

Assistant:

bool CppGenerator::resortView(const size_t& inc_view_id, const size_t& view_id)
{
    View* view = _qc->getView(inc_view_id);
    size_t orderIdx = 0;
    for (const size_t& var : variableOrder[view_id])
    {
        if (view->_fVars[var])
        {
            if (sortOrders[inc_view_id+_td->numberOfRelations()][orderIdx] != var)
                return true;
            ++orderIdx;
        }
    }

    return false;
}